

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<void>::reject<QtPromisePrivate::PromiseError_const&>
          (PromiseResolver<void> *this,PromiseError *error)

{
  QPromise<void> *pQVar1;
  Data *pDVar2;
  PromiseDataBase<void,void()> *this_00;
  PromiseDataBase<void,_void_()> *this_01;
  QPromise<void> *promise;
  PromiseError *error_local;
  PromiseResolver<void> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::operator->
                     (&this->m_d);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<void> *)0x0) {
    this_00 = (PromiseDataBase<void,void()> *)
              QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>::operator->
                        (&(pQVar1->super_QPromiseBase<void>).m_d);
    PromiseDataBase<void,void()>::reject<QtPromisePrivate::PromiseError_const&>(this_00,error);
    this_01 = &QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>::operator->
                         (&(pQVar1->super_QPromiseBase<void>).m_d)->
               super_PromiseDataBase<void,_void_()>;
    PromiseDataBase<void,_void_()>::dispatch(this_01);
    release(this);
  }
  return;
}

Assistant:

void reject(E&& error)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->reject(std::forward<E>(error));
            promise->m_d->dispatch();
            release();
        }
    }